

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O0

int duckdb_je_ctl_bymib(tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
                       size_t newlen)

{
  _Bool _Var1;
  tsd_t *in_RCX;
  tsdn_t *in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  size_t *in_R8;
  size_t in_R9;
  undefined8 in_stack_00000008;
  ctl_named_node_t *node;
  int ret;
  long local_48;
  int local_3c;
  
  if ((ctl_initialized) || (_Var1 = ctl_init(in_RCX), !_Var1)) {
    local_3c = ctl_lookupbymib(in_RDX,(ctl_named_node_t **)in_RCX,in_R8,in_R9);
    if (local_3c == 0) {
      if ((local_48 == 0) || (*(long *)(local_48 + 0x20) == 0)) {
        local_3c = 2;
      }
      else {
        local_3c = (**(code **)(local_48 + 0x20))
                             (in_RDI,in_RSI,in_RDX,in_RCX,in_R8,in_R9,in_stack_00000008);
      }
    }
  }
  else {
    local_3c = 0xb;
  }
  return local_3c;
}

Assistant:

int
ctl_bymib(tsd_t *tsd, const size_t *mib, size_t miblen, void *oldp,
    size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	const ctl_named_node_t *node;

	if (!ctl_initialized && ctl_init(tsd)) {
		ret = EAGAIN;
		goto label_return;
	}

	ret = ctl_lookupbymib(tsd_tsdn(tsd), &node, mib, miblen);
	if (ret != 0) {
		goto label_return;
	}

	/* Call the ctl function. */
	if (node && node->ctl) {
		ret = node->ctl(tsd, mib, miblen, oldp, oldlenp, newp, newlen);
	} else {
		/* Partial MIB. */
		ret = ENOENT;
	}

label_return:
	return(ret);
}